

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O3

int __thiscall Server::Private::remove(Private *this,char *__filename)

{
  usize *puVar1;
  Item *pIVar2;
  Item *pIVar3;
  Item *pIVar4;
  Item *pIVar5;
  long lVar6;
  Item *local_18;
  
  local_18 = (this->_queuedTimers).root;
  if (local_18 != (Item *)0x0) {
    do {
      lVar6 = 0x20;
      if ((*(long *)(__filename + 8) <= local_18->key) &&
         (lVar6 = 0x18, local_18->key <= *(long *)(__filename + 8))) {
        pIVar4 = (this->_queuedTimers)._end.item;
        if (local_18 != pIVar4) {
          goto LAB_0010e2c3;
        }
        break;
      }
      local_18 = *(Item **)((long)&local_18->key + lVar6);
    } while (local_18 != (Item *)0x0);
  }
LAB_0010e271:
  pIVar2 = *(Item **)(__filename + -0x10);
  pIVar3 = *(Item **)(__filename + -8);
  pIVar5 = (Item *)&this->_timers;
  if (pIVar2 != (Item *)0x0) {
    pIVar5 = pIVar2;
  }
  ((Iterator *)&pIVar5->next)->item = pIVar3;
  pIVar3->prev = pIVar2;
  puVar1 = &(this->_timers)._size;
  *puVar1 = *puVar1 - 1;
  *(Item **)(__filename + -0x10) = (this->_timers).freeItem;
  (this->_timers).freeItem = (Item *)(__filename + -0x10);
  return (int)(Item *)(__filename + -0x10);
LAB_0010e2c3:
  if (local_18->value == (TimerImpl *)__filename) {
    MultiMap<long,_Server::Private::TimerImpl_*>::remove(&this->_queuedTimers,(char *)&local_18);
    goto LAB_0010e271;
  }
  if ((local_18->key != *(long *)(__filename + 8)) ||
     (local_18 = local_18->next, local_18 == pIVar4)) goto LAB_0010e271;
  goto LAB_0010e2c3;
}

Assistant:

void Server::Private::remove(TimerImpl &timer)
{
  for (MultiMap<int64, TimerImpl *>::Iterator i = _queuedTimers.find(timer.executionTime), end = _queuedTimers.end(); i != end; ++i)
  {
    if (*i == &timer)
    {
      _queuedTimers.remove(i);
      break;
    }
    if (i.key() != timer.executionTime)
      break;
  }
  _timers.remove(timer);
}